

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

uchar * __thiscall cxxopts::OptionValue::as<unsigned_char>(OptionValue *this)

{
  long lVar1;
  uchar *puVar2;
  element_type *peVar3;
  allocator<char> local_31;
  string local_30;
  
  peVar3 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"No value",&local_31);
    throw_or_mimic<std::domain_error>(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    peVar3 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  lVar1 = __dynamic_cast(peVar3,&Value::typeinfo,&values::standard_value<unsigned_char>::typeinfo,0)
  ;
  if (lVar1 != 0) {
    puVar2 = *(uchar **)(lVar1 + 0x28);
    if (puVar2 == (uchar *)0x0) {
      puVar2 = *(uchar **)(lVar1 + 0x18);
    }
    return puVar2;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
    as() const
    {
      if (m_value == nullptr) {
        throw_or_mimic<std::domain_error>("No value");
      }

#ifdef CXXOPTS_NO_RTTI
      return static_cast<const values::standard_value<T>&>(*m_value).get();
#else
      return dynamic_cast<const values::standard_value<T>&>(*m_value).get();
#endif
    }